

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdirlisting.cpp
# Opt level: O0

void __thiscall QDirListingPrivate::advance(QDirListingPrivate *this)

{
  bool bVar1;
  uint uVar2;
  pointer pQVar3;
  long in_FS_OFFSET;
  QFileSystemIterator *it_1;
  QAbstractFileEngineIterator *it;
  QDirEntryInfo entryInfo_1;
  QDirEntryInfo entryInfo;
  QDirEntryInfo *in_stack_fffffffffffffdf8;
  QDirEntryInfo *in_stack_fffffffffffffe00;
  QDirListingPrivate *in_stack_fffffffffffffe08;
  QDirEntryInfo *in_stack_fffffffffffffe10;
  QFileSystemMetaData *in_stack_fffffffffffffe70;
  QFileSystemEntry *in_stack_fffffffffffffe78;
  QFileSystemIterator *in_stack_fffffffffffffe80;
  undefined1 local_108 [128];
  undefined1 *local_88;
  undefined1 *puStack_80;
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  undefined1 *puStack_30;
  undefined1 *local_28;
  undefined1 *puStack_20;
  undefined1 *local_18;
  undefined1 *puStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_> *)
                     0x295110);
  if (bVar1) {
    while (bVar1 = std::
                   vector<std::unique_ptr<QAbstractFileEngineIterator,_std::default_delete<QAbstractFileEngineIterator>_>,_std::allocator<std::unique_ptr<QAbstractFileEngineIterator,_std::default_delete<QAbstractFileEngineIterator>_>_>_>
                   ::empty((vector<std::unique_ptr<QAbstractFileEngineIterator,_std::default_delete<QAbstractFileEngineIterator>_>,_std::allocator<std::unique_ptr<QAbstractFileEngineIterator,_std::default_delete<QAbstractFileEngineIterator>_>_>_>
                            *)in_stack_fffffffffffffe08), ((bVar1 ^ 0xffU) & 1) != 0) {
      while( true ) {
        std::
        vector<std::unique_ptr<QAbstractFileEngineIterator,_std::default_delete<QAbstractFileEngineIterator>_>,_std::allocator<std::unique_ptr<QAbstractFileEngineIterator,_std::default_delete<QAbstractFileEngineIterator>_>_>_>
        ::back((vector<std::unique_ptr<QAbstractFileEngineIterator,_std::default_delete<QAbstractFileEngineIterator>_>,_std::allocator<std::unique_ptr<QAbstractFileEngineIterator,_std::default_delete<QAbstractFileEngineIterator>_>_>_>
                *)in_stack_fffffffffffffe08);
        pQVar3 = std::
                 unique_ptr<QAbstractFileEngineIterator,_std::default_delete<QAbstractFileEngineIterator>_>
                 ::get((unique_ptr<QAbstractFileEngineIterator,_std::default_delete<QAbstractFileEngineIterator>_>
                        *)in_stack_fffffffffffffe00);
        uVar2 = (*pQVar3->_vptr_QAbstractFileEngineIterator[2])();
        if ((uVar2 & 1) == 0) break;
        local_18 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_10 = &DAT_aaaaaaaaaaaaaaaa;
        local_28 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
        local_38 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
        local_48 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
        local_58 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
        local_68 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
        local_78 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
        local_88 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
        QDirEntryInfo::QDirEntryInfo(in_stack_fffffffffffffe10);
        (*pQVar3->_vptr_QAbstractFileEngineIterator[4])(&stack0xfffffffffffffe70);
        std::optional<QFileInfo>::operator=
                  ((optional<QFileInfo> *)in_stack_fffffffffffffe10,
                   (QFileInfo *)in_stack_fffffffffffffe08);
        QFileInfo::~QFileInfo((QFileInfo *)0x295204);
        bVar1 = entryMatches(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
        if (bVar1) {
          QDirEntryInfo::operator=(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
        }
        QDirEntryInfo::~QDirEntryInfo(in_stack_fffffffffffffe00);
        if (bVar1) goto LAB_002954b7;
      }
      std::
      vector<std::unique_ptr<QAbstractFileEngineIterator,_std::default_delete<QAbstractFileEngineIterator>_>,_std::allocator<std::unique_ptr<QAbstractFileEngineIterator,_std::default_delete<QAbstractFileEngineIterator>_>_>_>
      ::pop_back((vector<std::unique_ptr<QAbstractFileEngineIterator,_std::default_delete<QAbstractFileEngineIterator>_>,_std::allocator<std::unique_ptr<QAbstractFileEngineIterator,_std::default_delete<QAbstractFileEngineIterator>_>_>_>
                  *)in_stack_fffffffffffffe00);
    }
  }
  else {
    memset(local_108,0xaa,0x80);
    QDirEntryInfo::QDirEntryInfo(in_stack_fffffffffffffe10);
    while (bVar1 = std::
                   vector<std::unique_ptr<QFileSystemIterator,_std::default_delete<QFileSystemIterator>_>,_std::allocator<std::unique_ptr<QFileSystemIterator,_std::default_delete<QFileSystemIterator>_>_>_>
                   ::empty((vector<std::unique_ptr<QFileSystemIterator,_std::default_delete<QFileSystemIterator>_>,_std::allocator<std::unique_ptr<QFileSystemIterator,_std::default_delete<QFileSystemIterator>_>_>_>
                            *)in_stack_fffffffffffffe08), ((bVar1 ^ 0xffU) & 1) != 0) {
      while( true ) {
        std::
        vector<std::unique_ptr<QFileSystemIterator,_std::default_delete<QFileSystemIterator>_>,_std::allocator<std::unique_ptr<QFileSystemIterator,_std::default_delete<QFileSystemIterator>_>_>_>
        ::back((vector<std::unique_ptr<QFileSystemIterator,_std::default_delete<QFileSystemIterator>_>,_std::allocator<std::unique_ptr<QFileSystemIterator,_std::default_delete<QFileSystemIterator>_>_>_>
                *)in_stack_fffffffffffffe08);
        std::unique_ptr<QFileSystemIterator,_std::default_delete<QFileSystemIterator>_>::get
                  ((unique_ptr<QFileSystemIterator,_std::default_delete<QFileSystemIterator>_> *)
                   in_stack_fffffffffffffe00);
        bVar1 = QFileSystemIterator::advance
                          (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
                           in_stack_fffffffffffffe70);
        if (!bVar1) break;
        bVar1 = entryMatches(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
        if (bVar1) {
          QDirEntryInfo::operator=(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
          goto LAB_0029548d;
        }
        in_stack_fffffffffffffe08 = (QDirListingPrivate *)0x0;
        in_stack_fffffffffffffe78 = (QFileSystemEntry *)0x0;
        in_stack_fffffffffffffe80 = (QFileSystemIterator *)0x0;
        QDirEntryInfo::QDirEntryInfo((QDirEntryInfo *)0x0);
        QDirEntryInfo::operator=(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
        QDirEntryInfo::~QDirEntryInfo(in_stack_fffffffffffffe00);
      }
      std::
      vector<std::unique_ptr<QFileSystemIterator,_std::default_delete<QFileSystemIterator>_>,_std::allocator<std::unique_ptr<QFileSystemIterator,_std::default_delete<QFileSystemIterator>_>_>_>
      ::pop_back((vector<std::unique_ptr<QFileSystemIterator,_std::default_delete<QFileSystemIterator>_>,_std::allocator<std::unique_ptr<QFileSystemIterator,_std::default_delete<QFileSystemIterator>_>_>_>
                  *)in_stack_fffffffffffffe00);
    }
LAB_0029548d:
    QDirEntryInfo::~QDirEntryInfo(in_stack_fffffffffffffe00);
  }
LAB_002954b7:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDirListingPrivate::advance()
{
    // Use get() in both code paths below because the iterator returned by back()
    // may be invalidated due to reallocation when appending new iterators in
    // pushDirectory().

    if (engine) {
        while (!fileEngineIterators.empty()) {
            // Find the next valid iterator that matches the filters.
            QAbstractFileEngineIterator *it;
            while (it = fileEngineIterators.back().get(), it->advance()) {
                QDirEntryInfo entryInfo;
                entryInfo.fileInfoOpt = it->currentFileInfo();
                if (entryMatches(entryInfo)) {
                    currentEntryInfo = std::move(entryInfo);
                    return;
                }
            }

            fileEngineIterators.pop_back();
        }
    } else {
#ifndef QT_NO_FILESYSTEMITERATOR
        QDirEntryInfo entryInfo;
        while (!nativeIterators.empty()) {
            // Find the next valid iterator that matches the filters.
            QFileSystemIterator *it;
            while (it = nativeIterators.back().get(),
                   it->advance(entryInfo.entry, entryInfo.metaData)) {
                if (entryMatches(entryInfo)) {
                    currentEntryInfo = std::move(entryInfo);
                    return;
                }
                entryInfo = {};
            }

            nativeIterators.pop_back();
        }
#endif
    }
}